

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t unique_xor(uint16_t *out,uint32_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 1;
  for (uVar2 = 1; uVar2 < len; uVar2 = uVar2 + 1) {
    if (out[uVar2] == out[uVar2 - 1]) {
      uVar1 = uVar1 - 1;
    }
    else {
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
      out[uVar3] = out[uVar2];
    }
  }
  return uVar1;
}

Assistant:

CROARING_UNTARGET_AVX2

// working in-place, this function overwrites the repeated values
// could be avoided? Warning: assumes len > 0
static inline uint32_t unique_xor(uint16_t *out, uint32_t len) {
    uint32_t pos = 1;
    for (uint32_t i = 1; i < len; ++i) {
        if (out[i] != out[i - 1]) {
            out[pos++] = out[i];
        } else
            pos--;  // if it is identical to previous, delete it
    }
    return pos;
}